

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_sha512_self_test(int verbose)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  mbedtls_sha512_context ctx;
  uchar sha512sum [64];
  uchar buf [1024];
  mbedtls_sha512_context local_558;
  uchar local_478 [64];
  uchar local_438 [1032];
  
  memset(&local_558,0,0xd8);
  uVar3 = 0;
  while( true ) {
    uVar4 = (int)uVar3 + (int)((uVar3 & 0xffffffff) / 3) * -3;
    if (verbose != 0) {
      printf("  SHA-%d test #%d: ",(ulong)((uint)(2 < uVar3) * 0x80 + 0x180),(ulong)(uVar4 + 1));
    }
    local_558.total[0] = 0;
    local_558.total[1] = 0;
    if (uVar3 < 3) {
      local_558.state[0] = 0xcbbb9d5dc1059ed8;
      local_558.state[1] = 0x629a292a367cd507;
      local_558.state[2] = 0x9159015a3070dd17;
      local_558.state[3] = 0x152fecd8f70e5939;
      local_558.state[4] = 0x67332667ffc00b31;
      local_558.state[5] = 0x8eb44a8768581511;
      local_558.state[6] = 0xdb0c2e0d64f98fa7;
      local_558.state[7] = 0x47b5481dbefa4fa4;
    }
    else {
      local_558.state[0] = 0x6a09e667f3bcc908;
      local_558.state[1] = 0xbb67ae8584caa73b;
      local_558.state[2] = 0x3c6ef372fe94f82b;
      local_558.state[3] = 0xa54ff53a5f1d36f1;
      local_558.state[4] = 0x510e527fade682d1;
      local_558.state[5] = 0x9b05688c2b3e6c1f;
      local_558.state[6] = 0x1f83d9abfb41bd6b;
      local_558.state[7] = 0x5be0cd19137e2179;
    }
    local_558.is384 = (int)(uVar3 < 3);
    if (uVar4 == 2) {
      memset(local_438,0x61,1000);
      iVar2 = 1000;
      do {
        mbedtls_sha512_update(&local_558,local_438,1000);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    else {
      mbedtls_sha512_update(&local_558,sha512_test_buf[uVar4],(long)sha512_test_buflen[uVar4]);
    }
    mbedtls_sha512_finish(&local_558,local_478);
    iVar2 = bcmp(local_478,sha512_test_sum + uVar3,(ulong)(2 < uVar3) * 0x10 + 0x30);
    if (iVar2 != 0) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 6) {
      iVar2 = 0;
      if (verbose != 0) {
        putchar(10);
        iVar2 = 0;
      }
LAB_00131064:
      lVar1 = 0;
      do {
        *(undefined1 *)((long)local_558.total + lVar1) = 0;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0xd8);
      return iVar2;
    }
  }
  iVar2 = 1;
  if (verbose != 0) {
    puts("failed");
  }
  goto LAB_00131064;
}

Assistant:

int mbedtls_sha512_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char buf[1024];
    unsigned char sha512sum[64];
    mbedtls_sha512_context ctx;

    mbedtls_sha512_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 512 - k * 128, j + 1 );

        mbedtls_sha512_starts( &ctx, k );

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
                mbedtls_sha512_update( &ctx, buf, buflen );
        }
        else
            mbedtls_sha512_update( &ctx, sha512_test_buf[j],
                                 sha512_test_buflen[j] );

        mbedtls_sha512_finish( &ctx, sha512sum );

        if( memcmp( sha512sum, sha512_test_sum[i], 64 - k * 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_sha512_free( &ctx );

    return( ret );
}